

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator.cpp
# Opt level: O2

void print_block(Function *f)

{
  Value *this;
  ostream *poVar1;
  _List_node_base *p_Var2;
  Value *pVVar3;
  iterator __end3;
  string local_50;
  
  p_Var2 = (_List_node_base *)&f->basic_blocks_;
  while (p_Var2 = (((_List_base<BasicBlock_*,_std::allocator<BasicBlock_*>_> *)&p_Var2->_M_next)->
                  _M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)&f->basic_blocks_) {
    this = (Value *)p_Var2[1]._M_next;
    if (*(char *)&this[2].type_ == '\0') {
      Value::get_name_abi_cxx11_(&local_50,this);
      poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
      poVar1 = std::operator<<(poVar1,"has ");
      poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      poVar1 = std::operator<<(poVar1," pre block ");
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::~string((string *)&local_50);
      pVVar3 = this + 1;
      while (pVVar3 = (Value *)pVVar3->_vptr_Value, pVVar3 != this + 1) {
        Value::get_name_abi_cxx11_
                  (&local_50,
                   (Value *)(pVVar3->use_list_).super__List_base<Use,_std::allocator<Use>_>._M_impl.
                            _M_node.super__List_node_base._M_next);
        poVar1 = std::operator<<((ostream *)&std::cout,(string *)&local_50);
        std::endl<char,std::char_traits<char>>(poVar1);
        std::__cxx11::string::~string((string *)&local_50);
      }
    }
  }
  return;
}

Assistant:

void print_block(Function* f){
    for(auto bb: f->get_basic_blocks()){
        //std::cout << "**********" << std::endl;
        //std::cout << bb->get_name() << " is a " << (bb->is_fake_block() ? "fake block" : "true block") << std::endl;
        if(!bb->is_fake_block()){
            std::cout << bb->get_name() << "has " << bb->get_pre_basic_blocks().size() << " pre block " << std::endl;
            for(auto succ: bb->get_pre_basic_blocks()){
                std::cout<< succ->get_name() << std::endl;
            }
        }
        //std::cout << "**********" << std::endl;
    }
}